

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtGImpactCollisionAlgorithm::gimpact_vs_shape_find_pairs
          (cbtGImpactCollisionAlgorithm *this,cbtTransform *trans0,cbtTransform *trans1,
          cbtGImpactShapeInterface *shape0,cbtCollisionShape *shape1,
          cbtAlignedObjectArray<int> *collided_primitives)

{
  bool bVar1;
  cbtAABB boxshape;
  cbtTransform trans1to0;
  uint local_94;
  cbtAABB local_90;
  cbtTransform local_70;
  
  if ((shape0->m_box_set).m_box_tree.m_num_nodes == 0) {
    (*shape1->_vptr_cbtCollisionShape[2])(shape1,trans1,&local_90,&local_90.m_max);
    local_94 = (*(shape0->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape
                 [0x16])(shape0);
    while( true ) {
      bVar1 = local_94 == 0;
      local_94 = local_94 - 1;
      if (bVar1) break;
      (*(shape0->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x1e])
                (shape0,(ulong)local_94,trans0,&local_70,local_70.m_basis.m_el + 1);
      bVar1 = cbtAABB::has_collision(&local_90,(cbtAABB *)&local_70);
      if (bVar1) {
        cbtAlignedObjectArray<int>::push_back(collided_primitives,(int *)&local_94);
      }
    }
  }
  else {
    cbtTransform::inverse(&local_70,trans0);
    cbtTransform::operator*=(&local_70,trans1);
    (*shape1->_vptr_cbtCollisionShape[2])(shape1,&local_70,&local_90,&local_90.m_max);
    cbtGImpactQuantizedBvh::boxQuery(&shape0->m_box_set,&local_90,collided_primitives);
  }
  return;
}

Assistant:

void cbtGImpactCollisionAlgorithm::gimpact_vs_shape_find_pairs(
	const cbtTransform& trans0,
	const cbtTransform& trans1,
	const cbtGImpactShapeInterface* shape0,
	const cbtCollisionShape* shape1,
	cbtAlignedObjectArray<int>& collided_primitives)
{
	cbtAABB boxshape;

	if (shape0->hasBoxSet())
	{
		cbtTransform trans1to0 = trans0.inverse();
		trans1to0 *= trans1;

		shape1->getAabb(trans1to0, boxshape.m_min, boxshape.m_max);

		shape0->getBoxSet()->boxQuery(boxshape, collided_primitives);
	}
	else
	{
		shape1->getAabb(trans1, boxshape.m_min, boxshape.m_max);

		cbtAABB boxshape0;
		int i = shape0->getNumChildShapes();

		while (i--)
		{
			shape0->getChildAabb(i, trans0, boxshape0.m_min, boxshape0.m_max);

			if (boxshape.has_collision(boxshape0))
			{
				collided_primitives.push_back(i);
			}
		}
	}
}